

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O2

void cpool_run_conn_shutdown_handler(Curl_easy *data,connectdata *conn)

{
  undefined1 *puVar1;
  _func_CURLcode_Curl_easy_ptr_connectdata_ptr__Bool *p_Var2;
  
  if (((conn->bits).field_0x3 & 0x80) == 0) {
    if (conn->dns_entry != (Curl_dns_entry *)0x0) {
      Curl_resolv_unlink(data,&conn->dns_entry);
    }
    Curl_http_auth_cleanup_ntlm(conn);
    if ((conn->handler != (Curl_handler *)0x0) &&
       (p_Var2 = conn->handler->disconnect,
       p_Var2 != (_func_CURLcode_Curl_easy_ptr_connectdata_ptr__Bool *)0x0)) {
      (*p_Var2)(data,conn,(_Bool)((byte)((uint)*(undefined4 *)&conn->bits >> 0x1e) & 1));
    }
    Curl_resolver_cancel(data);
    puVar1 = &(conn->bits).field_0x3;
    *puVar1 = *puVar1 | 0x80;
  }
  return;
}

Assistant:

static void cpool_run_conn_shutdown_handler(struct Curl_easy *data,
                                            struct connectdata *conn)
{
  if(!conn->bits.shutdown_handler) {
    if(conn->dns_entry)
      Curl_resolv_unlink(data, &conn->dns_entry);

    /* Cleanup NTLM connection-related data */
    Curl_http_auth_cleanup_ntlm(conn);

    /* Cleanup NEGOTIATE connection-related data */
    Curl_http_auth_cleanup_negotiate(conn);

    if(conn->handler && conn->handler->disconnect) {
      /* This is set if protocol-specific cleanups should be made */
      DEBUGF(infof(data, "connection #%" FMT_OFF_T
                   ", shutdown protocol handler (aborted=%d)",
                   conn->connection_id, conn->bits.aborted));

      conn->handler->disconnect(data, conn, conn->bits.aborted);
    }

    /* possible left-overs from the async name resolvers */
    Curl_resolver_cancel(data);

    conn->bits.shutdown_handler = TRUE;
  }
}